

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O0

LogStream * __thiscall tt::LogStream::operator<<(LogStream *this,unsigned_long_long v)

{
  unsigned_long_long v_local;
  LogStream *this_local;
  
  formatInteger<unsigned_long_long>(this,v);
  return this;
}

Assistant:

LogStream& LogStream::operator<< (unsigned long long v){
	formatInteger(v);

	return *this;
}